

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O3

Status pack(Header *header,FILE *ifp,FILE *ofp)

{
  Byte byte;
  Byte byte_00;
  Ferror FVar1;
  Word WVar2;
  int bytecount;
  Status SVar3;
  char *fmt;
  
  WVar2 = header->origlen;
  init_garble();
  complen = 0;
  crc = 0;
  byte = read_byte(ifp);
  bytecount = 1;
  do {
    WVar2 = WVar2 - 1;
    byte_00 = byte;
    if (WVar2 == 0) break;
    byte_00 = read_byte(ifp);
    if (byte == 0x90) {
      bytecount = 1;
      write_ncr(ofp,0x90,1);
    }
    else if (bytecount < 0xfe && byte_00 == byte) {
      bytecount = bytecount + 1;
    }
    else {
      write_ncr(ofp,byte,bytecount);
      bytecount = 1;
    }
    FVar1 = check_stream(ifp);
    byte = byte_00;
  } while (FVar1 == FNOERR);
  write_ncr(ofp,byte_00,bytecount);
  FVar1 = check_stream(ifp);
  SVar3 = RERR;
  if (FVar1 != FRWERR) {
    if (testing == '\0') {
      FVar1 = check_stream(ofp);
      if (FVar1 == FRWERR) {
        return WERR;
      }
      fmt = "OK (packed)";
      if (testing == '\0') {
        fmt = "packed";
      }
    }
    else {
      fmt = "OK (packed)";
    }
    SVar3 = NOERR;
    msg(fmt);
    header->crc = (Halfword)crc;
    header->complen = complen;
  }
  return SVar3;
}

Assistant:

Status
pack(Header *header, FILE *ifp, FILE *ofp)
{
	register Word len = header->origlen;
	Byte prevbyte = '\0', byte;
	int bytecount = 0;

    init_garble();

	complen = 0;
	crc = 0;
	prevbyte = read_byte(ifp);
	len--;
	bytecount = 1;
	while (len--)
	{
		byte = read_byte(ifp);
		if(prevbyte == RUNMARK)
		{
			write_ncr(ofp, prevbyte, 1);
			bytecount = 1;
		}
		else if (byte == prevbyte && bytecount < 254)
		{
			bytecount++;
		}
		else
		{
			write_ncr(ofp, prevbyte, bytecount);
			bytecount = 1;
		}
		prevbyte = byte;
		if (check_stream(ifp) != FNOERR)
			break;
	}
	write_ncr(ofp, prevbyte, bytecount);

	if (check_stream(ifp) == FRWERR)
		return (RERR);
	if (!testing && check_stream(ofp) == FRWERR)
		return (WERR);
	if (testing)
		msg("OK (packed)");
	else
		msg("packed");

	header->crc = (Halfword) crc;
	header->complen = complen;

	return (NOERR);
}